

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetDomainsByAliases
          (Registry *this,StringArray *aAliases,DomainArray *aRet,StringArray *aUnresolved)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  Status SVar4;
  char cVar5;
  int iVar6;
  pointer __lhs;
  DomainArray domains;
  DomainArray result;
  Domain dom;
  Network nwk;
  
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  domains.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __lhs = (aAliases->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (aAliases->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == pbVar1) {
      std::
      vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
      ::
      insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Domain*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>,void>
                ((vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
                  *)aRet,(aRet->
                         super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                         )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
                  )domains.
                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
                  )domains.
                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      SVar4 = domains.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              domains.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start;
      break;
    }
    Domain::Domain(&dom);
    _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
    if (_Var3) {
      Network::Network(&nwk);
      SVar4 = GetCurrentNetwork(this,&nwk);
      if (SVar4 == kSuccess) {
        iVar6 = (*this->mStorage->_vptr_PersistentStorage[0xd])(this->mStorage,&nwk.mDomainId,&dom);
        SVar4 = ((char)iVar6 != '\0') << 2;
        if ((char)iVar6 == '\x01') {
          SVar4 = kNotFound;
        }
      }
      Network::~Network(&nwk);
LAB_00180cae:
      iVar6 = 0;
      if (SVar4 == kSuccess) {
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::push_back(&domains,&dom);
        SVar4 = kSuccess;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(aUnresolved,__lhs);
      }
    }
    else {
      result.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Domain::Domain((Domain *)&nwk);
      std::__cxx11::string::_M_assign((string *)&nwk.mName);
      iVar6 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,&nwk,&result);
      cVar5 = (char)iVar6;
      SVar4 = (cVar5 != '\0') << 2;
      if (cVar5 == '\x01') {
        SVar4 = kNotFound;
      }
      bVar2 = true;
      if (cVar5 == '\0') {
        if ((long)result.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)result.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x28) {
          iVar6 = 0;
          Domain::operator=(&dom,result.
                                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          SVar4 = kSuccess;
        }
        else {
          iVar6 = 0;
          SVar4 = kSuccess;
          if (1 < (ulong)(((long)result.
                                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)result.
                                super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(aUnresolved,__lhs);
            SVar4 = kAmbiguity;
            bVar2 = false;
            iVar6 = 6;
          }
        }
      }
      else {
        iVar6 = 0;
      }
      std::__cxx11::string::~string((string *)&nwk.mName);
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::~vector(&result);
      if (bVar2) goto LAB_00180cae;
    }
    std::__cxx11::string::~string((string *)&dom.mName);
    __lhs = __lhs + 1;
  } while (iVar6 == 0);
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&domains);
  return SVar4;
}

Assistant:

Registry::Status Registry::GetDomainsByAliases(const StringArray &aAliases, DomainArray &aRet, StringArray &aUnresolved)
{
    Registry::Status status;
    DomainArray      domains;

    for (const auto &alias : aAliases)
    {
        Domain dom;

        if (alias == ALIAS_THIS)
        {
            Network nwk;
            status = GetCurrentNetwork(nwk);
            if (status == Registry::Status::kSuccess)
            {
                status = MapStatus(mStorage->Get(nwk.mDomainId, dom));
            }
        }
        else
        {
            DomainArray result;
            Domain      pred;
            pred.mName = alias;
            status     = MapStatus(mStorage->Lookup(pred, result));
            if (status == Registry::Status::kSuccess)
            {
                if (result.size() == 1)
                {
                    dom = result.front();
                }
                else if (result.size() > 1)
                {
                    aUnresolved.push_back(alias);
                    ExitNow(status = Registry::Status::kAmbiguity);
                }
            }
        }
        if (status == Registry::Status::kSuccess)
        {
            domains.push_back(dom);
        }
        else
        {
            aUnresolved.push_back(alias);
        }
    }
    aRet.insert(aRet.end(), domains.begin(), domains.end());
    status = domains.size() > 0 ? Registry::Status::kSuccess : Registry::Status::kNotFound;
exit:
    return status;
}